

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_hdr_meta.c
# Opt level: O0

void fill_hdr_meta_to_frame(MppFrame frame,MppCodingType in_type)

{
  undefined2 uVar1;
  MppFrameContentLightMetadata MVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  uint val;
  uint val_00;
  MppFrameColorTransferCharacteristic MVar5;
  MppFrameColorSpace MVar6;
  MppFrameColorPrimaries MVar7;
  MppBuffer buffer;
  void *pvVar8;
  MppFrameHdrDynamicMeta *pMVar9;
  size_t sVar10;
  MppMeta meta_00;
  undefined2 *puVar11;
  undefined2 *puVar12;
  HdrStaticMeta *static_meta;
  RK_U32 downscale_height;
  RK_U32 downscale_width;
  HdrCodecType codec_type;
  RK_U32 total_size;
  RK_U32 dynamic_size;
  RK_U32 static_size;
  RK_U32 max_size;
  MppMeta meta;
  RK_U16 hdr_format;
  RK_U32 msg_idx;
  RkMetaHdrHeader *hdr_dynamic_meta_header;
  RkMetaHdrHeader *hdr_static_meta_header;
  undefined1 local_48 [4];
  MppFrameContentLightMetadata content_light;
  MppFrameMasteringDisplayMetadata mastering_display;
  MppFrameHdrDynamicMeta *dynamic_meta;
  void *ptr;
  MppBuffer buf;
  RK_U32 off;
  MppCodingType in_type_local;
  MppFrame frame_local;
  
  buf._0_4_ = hdr_get_offset_from_frame(frame);
  buffer = mpp_frame_get_buffer(frame);
  pvVar8 = mpp_buffer_get_ptr_with_caller(buffer,"fill_hdr_meta_to_frame");
  pMVar9 = mpp_frame_get_hdr_dynamic_meta(frame);
  mpp_frame_get_mastering_display((MppFrameMasteringDisplayMetadata *)local_48,frame);
  MVar2 = mpp_frame_get_content_light(frame);
  meta._2_2_ = 0;
  sVar10 = mpp_buffer_get_size_with_caller(buffer,"fill_hdr_meta_to_frame");
  codec_type = HDR_AVS2;
  downscale_height = 0xffffffff;
  if ((pvVar8 == (void *)0x0) || (buffer == (MppBuffer)0x0)) {
    _mpp_log_l(2,(char *)0x0,"buf is null!\n","fill_hdr_meta_to_frame");
  }
  else {
    RVar3 = mpp_frame_get_thumbnail_en(frame);
    if (RVar3 == 2) {
      RVar3 = mpp_frame_get_width(frame);
      RVar4 = mpp_frame_get_height(frame);
      buf._0_4_ = (RVar3 >> 1) * (RVar4 >> 1) * 3 >> 1;
    }
    val = (RK_U32)buf + 0xfff & 0xfffff000;
    if ((pMVar9 != (MppFrameHdrDynamicMeta *)0x0) && (pMVar9->size != 0)) {
      codec_type = pMVar9->size + 0x20;
    }
    val_00 = codec_type + 0x6c;
    if ((uint)sVar10 < val + val_00) {
      _mpp_log_l(2,(char *)0x0,"fill hdr meta overflow off %d size %d max %d\n",
                 "fill_hdr_meta_to_frame",(ulong)val,(ulong)val_00,(uint)sVar10);
    }
    else {
      meta_00 = mpp_frame_get_meta(frame);
      mpp_meta_set_s32(meta_00,KEY_HDR_META_OFFSET,val);
      puVar11 = (undefined2 *)((long)pvVar8 + (ulong)val);
      *puVar11 = 0x13e;
      puVar11[1] = 0x6c;
      meta._4_2_ = 1;
      puVar11[3] = 0;
      if (in_type == MPP_VIDEO_CodingAVC) {
        downscale_height = 2;
      }
      else if (in_type == MPP_VIDEO_CodingHEVC) {
        downscale_height = 1;
      }
      else if (in_type == MPP_VIDEO_CodingAVS2) {
        downscale_height = 0;
      }
      else if (in_type == MPP_VIDEO_CodingAV1) {
        downscale_height = 3;
      }
      puVar11[6] = 0;
      puVar11[7] = (undefined2)downscale_height;
      *(RK_U16 (*) [2])(puVar11 + 0x26) = mastering_display.white_point;
      *(RK_U16 (*) [2])(puVar11 + 0x28) = mastering_display.display_primaries[2];
      *(uint *)(puVar11 + 0x1a) = (uint)(ushort)local_48._0_2_;
      *(uint *)(puVar11 + 0x1c) = (uint)(ushort)local_48._2_2_;
      *(uint *)(puVar11 + 0x1e) = (uint)content_light.MaxCLL;
      *(uint *)(puVar11 + 0x20) = (uint)content_light.MaxFALL;
      *(uint *)(puVar11 + 0x16) = (uint)mastering_display.display_primaries[0][0];
      *(uint *)(puVar11 + 0x18) = (uint)mastering_display.display_primaries[0][1];
      *(uint *)(puVar11 + 0x22) = (uint)mastering_display.display_primaries[1][0];
      *(uint *)(puVar11 + 0x24) = (uint)mastering_display.display_primaries[1][1];
      MVar5 = mpp_frame_get_color_trc(frame);
      *(MppFrameColorTransferCharacteristic *)(puVar11 + 0x14) = MVar5;
      MVar6 = mpp_frame_get_colorspace(frame);
      *(MppFrameColorSpace *)(puVar11 + 0x10) = MVar6;
      MVar7 = mpp_frame_get_color_primaries(frame);
      *(MppFrameColorPrimaries *)(puVar11 + 0x12) = MVar7;
      *(uint *)(puVar11 + 0x2a) = (uint)MVar2 & 0xffff;
      *(uint *)(puVar11 + 0x2c) = (uint)MVar2 >> 0x10;
      if (downscale_height == 0) {
        if (*(int *)(puVar11 + 0x14) == 0xe) {
          meta._2_2_ = 2;
        }
        else {
          meta._2_2_ = (ushort)(*(int *)(puVar11 + 0x14) == 0xc);
        }
      }
      else if (downscale_height - 1 < 3) {
        if (*(int *)(puVar11 + 0x14) == 0x12) {
          meta._2_2_ = 2;
        }
        else {
          meta._2_2_ = (ushort)(*(int *)(puVar11 + 0x14) == 0x10);
        }
      }
      uVar1 = 1;
      if ((pMVar9 != (MppFrameHdrDynamicMeta *)0x0) && (uVar1 = meta._4_2_, pMVar9->size != 0)) {
        puVar12 = (undefined2 *)((long)pvVar8 + (ulong)((ushort)puVar11[1] + val));
        *puVar12 = 0x13e;
        puVar12[1] = (short)codec_type;
        puVar12[3] = 1;
        puVar12[6] = 1;
        puVar12[7] = (undefined2)downscale_height;
        meta._2_2_ = (ushort)pMVar9->hdr_fmt;
        memcpy(puVar12 + 0x10,pMVar9 + 1,(ulong)pMVar9->size);
        puVar12[2] = 2;
        puVar12[5] = meta._2_2_;
        uVar1 = 2;
      }
      meta._4_2_ = uVar1;
      mpp_meta_set_s32(meta_00,KEY_HDR_META_SIZE,val_00);
      puVar11[2] = meta._4_2_;
      puVar11[5] = meta._2_2_;
    }
  }
  return;
}

Assistant:

void fill_hdr_meta_to_frame(MppFrame frame, MppCodingType in_type)
{
    RK_U32 off = hdr_get_offset_from_frame(frame);
    MppBuffer buf = mpp_frame_get_buffer(frame);
    void *ptr = mpp_buffer_get_ptr(buf);
    MppFrameHdrDynamicMeta *dynamic_meta = mpp_frame_get_hdr_dynamic_meta(frame);
    MppFrameMasteringDisplayMetadata mastering_display = mpp_frame_get_mastering_display(frame);
    MppFrameContentLightMetadata content_light = mpp_frame_get_content_light(frame);
    RkMetaHdrHeader *hdr_static_meta_header;
    RkMetaHdrHeader *hdr_dynamic_meta_header;
    RK_U32 msg_idx = 0;
    RK_U16 hdr_format = HDR_NONE;
    MppMeta meta = NULL;
    RK_U32 max_size = mpp_buffer_get_size(buf);
    RK_U32 static_size, dynamic_size = 0, total_size = 0;
    HdrCodecType codec_type = HDR_CODEC_UNSPECIFIED;

    if (!ptr || !buf) {
        mpp_err_f("buf is null!\n");
        return;
    }

    if (mpp_frame_get_thumbnail_en(frame) == MPP_FRAME_THUMBNAIL_ONLY) {
        // only for 8K thumbnail downscale to 4K 8bit mode
        RK_U32 downscale_width = mpp_frame_get_width(frame) / 2;
        RK_U32 downscale_height = mpp_frame_get_height(frame) / 2;

        off = downscale_width * downscale_height * 3 / 2;
    }
    off = MPP_ALIGN(off, SZ_4K);

    static_size = sizeof(RkMetaHdrHeader) + sizeof(HdrStaticMeta);
    if (dynamic_meta && dynamic_meta->size)
        dynamic_size = sizeof(RkMetaHdrHeader) + dynamic_meta->size;

    total_size = static_size + dynamic_size;

    if ((off + total_size) > max_size) {
        mpp_err_f("fill hdr meta overflow off %d size %d max %d\n",
                  off, total_size, max_size);
        return;
    }
    meta = mpp_frame_get_meta(frame);
    mpp_meta_set_s32(meta, KEY_HDR_META_OFFSET, off);
    /* 1. fill hdr static meta date */
    hdr_static_meta_header = (RkMetaHdrHeader*)(ptr + off);
    /* For transmission */
    hdr_static_meta_header->magic = HDR_META_MAGIC;
    hdr_static_meta_header->size = static_size;
    hdr_static_meta_header->message_index = msg_idx++;

    switch (in_type) {
    case MPP_VIDEO_CodingAVS2 : {
        codec_type = HDR_AVS2;
    } break;
    case MPP_VIDEO_CodingHEVC : {
        codec_type = HDR_HEVC;
    } break;
    case MPP_VIDEO_CodingAVC : {
        codec_type = HDR_H264;
    } break;
    case MPP_VIDEO_CodingAV1 : {
        codec_type = HDR_AV1;
    } break;
    default : break;
    }

    /* For payload identification */
    hdr_static_meta_header->hdr_payload_type = STATIC;
    hdr_static_meta_header->video_format = codec_type;
    {
        HdrStaticMeta *static_meta = (HdrStaticMeta*)hdr_static_meta_header->payload;

        static_meta->min_luminance = mastering_display.min_luminance;
        static_meta->max_luminance = mastering_display.max_luminance;
        static_meta->green_x = mastering_display.display_primaries[0][0];
        static_meta->green_y = mastering_display.display_primaries[0][1];
        static_meta->blue_x = mastering_display.display_primaries[1][0];
        static_meta->blue_y = mastering_display.display_primaries[1][1];
        static_meta->red_x = mastering_display.display_primaries[2][0];
        static_meta->red_y = mastering_display.display_primaries[2][1];
        static_meta->white_point_x = mastering_display.white_point[0];
        static_meta->white_point_y = mastering_display.white_point[1];
        static_meta->color_trc = mpp_frame_get_color_trc(frame);
        static_meta->color_space = mpp_frame_get_colorspace(frame);
        static_meta->color_primaries = mpp_frame_get_color_primaries(frame);
        static_meta->max_cll = content_light.MaxCLL;
        static_meta->max_fall = content_light.MaxFALL;
        /*
         * hlg:
         *  hevc trc = 18
         *  avs trc = 14
         * hdr10:
         *  hevc/h264 trc = 16
         *  avs trc = 12
         */
        switch (codec_type) {
        case HDR_AV1 :
        case HDR_HEVC :
        case HDR_H264 : {
            if (static_meta->color_trc == MPP_FRAME_TRC_ARIB_STD_B67)
                hdr_format = HLG;
            else if (static_meta->color_trc == MPP_FRAME_TRC_SMPTEST2084)
                hdr_format = HDR10;
        } break;
        case HDR_AVS2 : {
            if (static_meta->color_trc == MPP_FRAME_TRC_BT2020_10)
                hdr_format = HLG;
            else if (static_meta->color_trc == MPP_FRAME_TRC_BT1361_ECG)
                hdr_format = HDR10;
        } break;
        default : {
        } break;
        }
    }
    off += hdr_static_meta_header->size;

    /* 2. fill hdr dynamic meta date */
    if (dynamic_meta && dynamic_meta->size) {
        hdr_dynamic_meta_header = (RkMetaHdrHeader*)(ptr + off);

        /* For transmission */
        hdr_dynamic_meta_header->magic = HDR_META_MAGIC;
        hdr_dynamic_meta_header->size = dynamic_size;
        hdr_dynamic_meta_header->message_index = msg_idx++;

        /* For payload identification */
        hdr_dynamic_meta_header->hdr_payload_type = DYNAMIC;
        hdr_dynamic_meta_header->video_format = codec_type;
        hdr_format = dynamic_meta->hdr_fmt;

        memcpy(hdr_dynamic_meta_header->payload, dynamic_meta->data, dynamic_meta->size);
        hdr_dynamic_meta_header->message_total = msg_idx;
        hdr_dynamic_meta_header->hdr_format = hdr_format;
    }

    mpp_meta_set_s32(meta, KEY_HDR_META_SIZE, total_size);
    hdr_static_meta_header->message_total = msg_idx;
    hdr_static_meta_header->hdr_format = hdr_format;
}